

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::numeric::numeric<long_long>(numeric *this,longlong *dat)

{
  longlong *dat_local;
  numeric *this_local;
  
  this->type = true;
  this->type = true;
  (this->data)._int = *dat;
  return;
}

Assistant:

numeric(const T &dat)
		{
			if (std::is_integral<T>::value) {
				type = 1;
				data._int = dat;
			}
			else {
				type = 0;
				data._num = dat;
			}
		}